

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O2

void __thiscall chrono::ChVariablesNode::ArchiveIN(ChVariablesNode *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChVariablesNode>(marchive);
  local_28._value = &this->mass;
  local_28._name = "mass";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChVariablesNode::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChVariablesNode>();
    // deserialize parent class
    ChVariables::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(mass);
    SetNodeMass(mass);
}